

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_truncate_vector(flatcc_builder_t *B,size_t count)

{
  size_t count_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type != 4) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3ee,"int flatcc_builder_truncate_vector(flatcc_builder_t *, size_t)");
  }
  if ((B->frame->container).table.pl_end < count) {
    if ((B->frame->container).table.pl_end < count) {
      __assert_fail("(B->frame[0].container.vector.count) >= count",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x3ef,"int flatcc_builder_truncate_vector(flatcc_builder_t *, size_t)");
    }
    B_local._4_4_ = -1;
  }
  else {
    (B->frame->container).table.pl_end = (B->frame->container).table.pl_end - (int)count;
    unpush_ds(B,(B->frame->container).table.vs_end * (int)count);
    B_local._4_4_ = 0;
  }
  return B_local._4_4_;
}

Assistant:

int flatcc_builder_truncate_vector(flatcc_builder_t *B, size_t count)
{
    check(frame(type) == flatcc_builder_vector, "expected vector frame");
    check_error(frame(container.vector.count) >= count, -1, "cannot truncate vector past empty");
    frame(container.vector.count) -= (uoffset_t)count;
    unpush_ds(B, frame(container.vector.elem_size) * (uoffset_t)count);
    return 0;
}